

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

void __thiscall Clasp::Solver::ccResolve(Solver *this,LitVec *cc,uint32 pos,LitVec *reason)

{
  bool bVar1;
  size_type sVar2;
  DecisionHeuristic *pDVar3;
  reference pLVar4;
  const_reference pLVar5;
  reference pLVar6;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *in_RCX;
  size_type in_EDX;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *in_RSI;
  undefined8 in_RDI;
  size_type i;
  Literal x;
  undefined4 in_stack_ffffffffffffff98;
  Var in_stack_ffffffffffffff9c;
  Solver *in_stack_ffffffffffffffa0;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *ppVar7;
  undefined4 in_stack_ffffffffffffffb0;
  size_type sVar8;
  size_type local_2c;
  Literal local_28;
  uint local_24;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *local_20;
  size_type local_14;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *local_10;
  
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  pDVar3 = SingleOwnerPtr<Clasp::DecisionHeuristic,_Clasp::DeleteObject>::operator->
                     ((SingleOwnerPtr<Clasp::DecisionHeuristic,_Clasp::DeleteObject> *)0x1ee46a);
  ppVar7 = local_20;
  pLVar4 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                     (local_10,local_14);
  local_24 = pLVar4->rep_;
  (*pDVar3->_vptr_DecisionHeuristic[10])(pDVar3,in_RDI,ppVar7,(ulong)local_24);
  Literal::Literal(&local_28);
  local_2c = 0;
  while( true ) {
    sVar8 = local_2c;
    sVar2 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size(local_20);
    if (sVar8 == sVar2) break;
    pLVar5 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                       (local_20,local_2c);
    local_28.rep_ = pLVar5->rep_;
    Literal::var(&local_28);
    bVar1 = seen(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    if (!bVar1) {
      Literal::var(&local_28);
      level(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      markLevel(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      ppVar7 = local_10;
      Literal::operator~((Literal *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                 CONCAT44(sVar8,in_stack_ffffffffffffffb0),(Literal *)ppVar7);
    }
    local_2c = local_2c + 1;
  }
  pLVar4 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                     (local_10,local_14);
  Literal::var(pLVar4);
  clearSeen(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  pLVar4 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                     (local_10,local_14);
  Literal::var(pLVar4);
  level(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  unmarkLevel(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  pLVar4 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::back(local_10);
  pLVar6 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                     (local_10,local_14);
  pLVar6->rep_ = pLVar4->rep_;
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::pop_back(local_10);
  return;
}

Assistant:

void Solver::ccResolve(LitVec& cc, uint32 pos, const LitVec& reason) {
	heuristic_->updateReason(*this, reason, cc[pos]);
	Literal x;
	for (LitVec::size_type i = 0; i != reason.size(); ++i) {
		x = reason[i];
		assert(isTrue(x));
		if (!seen(x.var())) {
			markLevel(level(x.var()));
			cc.push_back(~x);
		}
	}
	clearSeen(cc[pos].var());
	unmarkLevel(level(cc[pos].var()));
	cc[pos] = cc.back();
	cc.pop_back();
}